

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O0

tnt_schema * tnt_schema_new(tnt_schema *s)

{
  mh_assoc_t *pmVar1;
  tnt_schema *ptStack_18;
  int alloc;
  tnt_schema *s_local;
  
  ptStack_18 = s;
  if ((s == (tnt_schema *)0x0) &&
     (ptStack_18 = (tnt_schema *)tnt_mem_alloc(0x10), ptStack_18 == (tnt_schema *)0x0)) {
    s_local = (tnt_schema *)0x0;
  }
  else {
    pmVar1 = mh_assoc_new();
    ptStack_18->space_hash = pmVar1;
    ptStack_18->alloc = (uint)(s == (tnt_schema *)0x0);
    s_local = ptStack_18;
  }
  return s_local;
}

Assistant:

struct tnt_schema *tnt_schema_new(struct tnt_schema *s) {
	int alloc = (s == NULL);
	if (!s) {
		s = tnt_mem_alloc(sizeof(struct tnt_schema));
		if (!s) return NULL;
	}
	s->space_hash = mh_assoc_new();
	s->alloc = alloc;
	return s;
}